

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937.hpp
# Opt level: O2

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator<<(basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *out,mt19937 *R)

{
  undefined4 uVar1;
  wostream *pwVar2;
  char *pcVar3;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar4;
  
  uVar1 = *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = 0x26;
  pwVar2 = std::operator<<((wostream *)out,'[');
  pcVar3 = mt19937::name();
  pwVar2 = std::operator<<(pwVar2,pcVar3);
  pwVar2 = std::operator<<(pwVar2,' ');
  pbVar4 = operator<<((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)pwVar2,
                      (parameter_type *)R);
  pwVar2 = std::operator<<((wostream *)pbVar4,' ');
  pbVar4 = operator<<((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)pwVar2,&R->S);
  std::operator<<((wostream *)pbVar4,']');
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
  return out;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
        std::basic_ostream<char_t, traits_t> &out, const mt19937 &R) {
      std::ios_base::fmtflags flags(out.flags());
      out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      out << '[' << mt19937::name() << ' ' << R.P << ' ' << R.S << ']';
      out.flags(flags);
      return out;
    }